

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall Application::processOrder(Application *this,Order *order)

{
  bool bVar1;
  size_type sVar2;
  queue<Order,_std::deque<Order,_std::allocator<Order>_>_> orders;
  string sStack_88;
  queue<Order,_std::deque<Order,_std::allocator<Order>_>_> local_68;
  
  bVar1 = OrderMatcher::insert(&this->m_orderMatcher,order);
  if (bVar1) {
    acceptOrder(this,order);
    std::queue<Order,std::deque<Order,std::allocator<Order>>>::
    queue<std::deque<Order,std::allocator<Order>>,void>(&local_68);
    std::__cxx11::string::string((string *)&sStack_88,(string *)&order->m_symbol);
    OrderMatcher::match(&this->m_orderMatcher,&sStack_88,&local_68);
    std::__cxx11::string::~string((string *)&sStack_88);
    while( true ) {
      sVar2 = std::deque<Order,_std::allocator<Order>_>::size(&local_68.c);
      if (sVar2 == 0) break;
      fillOrder(this,local_68.c.super__Deque_base<Order,_std::allocator<Order>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur);
      std::deque<Order,_std::allocator<Order>_>::pop_front(&local_68.c);
    }
    std::deque<Order,_std::allocator<Order>_>::~deque(&local_68.c);
    return;
  }
  rejectOrder(this,order);
  return;
}

Assistant:

void Application::processOrder(const Order &order) {
  if (m_orderMatcher.insert(order)) {
    acceptOrder(order);

    std::queue<Order> orders;
    m_orderMatcher.match(order.getSymbol(), orders);

    while (orders.size()) {
      fillOrder(orders.front());
      orders.pop();
    }
  } else {
    rejectOrder(order);
  }
}